

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int robust_ftruncate(int h,sqlite3_int64 sz)

{
  int iVar1;
  int *piVar2;
  undefined8 in_RSI;
  uint in_EDI;
  bool bVar3;
  int rc;
  
  do {
    iVar1 = (*aSyscall[6].pCurrent)((ulong)in_EDI,in_RSI);
    bVar3 = false;
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  return iVar1;
}

Assistant:

static int robust_ftruncate(int h, sqlite3_int64 sz){
  int rc;
#ifdef __ANDROID__
  /* On Android, ftruncate() always uses 32-bit offsets, even if
  ** _FILE_OFFSET_BITS=64 is defined. This means it is unsafe to attempt to
  ** truncate a file to any size larger than 2GiB. Silently ignore any
  ** such attempts.  */
  if( sz>(sqlite3_int64)0x7FFFFFFF ){
    rc = SQLITE_OK;
  }else
#endif
  do{ rc = osFtruncate(h,sz); }while( rc<0 && errno==EINTR );
  return rc;
}